

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faces_kba.c
# Opt level: O3

void Faces_recv_faces_end
               (Faces *faces,StepScheduler *stepscheduler,Dimensions dims_b,int step,Env *env)

{
  bool bVar1;
  Request_t *pRVar2;
  bool bVar3;
  Bool_t BVar4;
  int dir_ind;
  bool bVar5;
  long lVar6;
  int axis;
  Request_t *request;
  
  if (faces->is_face_comm_async != 0) {
    Env_proc_x_this(env);
    Env_proc_y_this(env);
    Dimensions_size_facexz(dims_b,4,faces->noctant_per_block);
    Dimensions_size_faceyz(dims_b,4,faces->noctant_per_block);
    if (0 < faces->noctant_per_block) {
      lVar6 = 0;
      do {
        axis = 0;
        bVar3 = true;
        do {
          bVar1 = bVar3;
          pRVar2 = faces->request_recv_yz;
          if (bVar1) {
            pRVar2 = faces->request_recv_xz;
          }
          dir_ind = 0;
          bVar3 = true;
          do {
            bVar5 = bVar3;
            BVar4 = StepScheduler_must_do_recv(stepscheduler,step,axis,dir_ind,(int)lVar6,env);
            if (BVar4 != 0) {
              Env_wait(env,pRVar2 + lVar6);
            }
            dir_ind = 1;
            bVar3 = false;
          } while (bVar5);
          axis = 1;
          bVar3 = false;
        } while (bVar1);
        lVar6 = lVar6 + 1;
      } while (lVar6 < faces->noctant_per_block);
    }
    return;
  }
  __assert_fail("Faces_is_face_comm_async( faces )",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/faces_kba.c"
                ,0x1b3,"void Faces_recv_faces_end(Faces *, StepScheduler *, Dimensions, int, Env *)"
               );
}

Assistant:

void Faces_recv_faces_end(
  Faces*          faces,
  StepScheduler*  stepscheduler,
  Dimensions      dims_b,
  int             step,
  Env*            env )
{
  Assert( Faces_is_face_comm_async( faces ) );

  const int proc_x = Env_proc_x_this( env );
  const int proc_y = Env_proc_y_this( env );

  const size_t size_facexz_per_octant = Dimensions_size_facexz( dims_b,
                 NU, faces->noctant_per_block ) / faces->noctant_per_block;
  const size_t size_faceyz_per_octant = Dimensions_size_faceyz( dims_b,
                 NU, faces->noctant_per_block ) / faces->noctant_per_block;

  /*---Loop over octants---*/

  int octant_in_block = 0;

  for( octant_in_block=0; octant_in_block<faces->noctant_per_block;
                                                            ++octant_in_block )
  {
    /*---Communicate +/-X, +/-Y---*/

    int axis = 0;

    for( axis=0; axis<2; ++axis )
    {
      const Bool_t axis_x = axis==0;

      int dir_ind = 0;

      for( dir_ind=0; dir_ind<2; ++dir_ind )
      {
        /*---Determine whether to communicate---*/

        Bool_t const do_recv = StepScheduler_must_do_recv(
                   stepscheduler, step, axis, dir_ind, octant_in_block, env );

        if( do_recv )
        {
          Request_t* request = axis_x ?
                                   & faces->request_recv_xz[octant_in_block]
                                 : & faces->request_recv_yz[octant_in_block];
          Env_wait( env, request );
        }
      } /*---dir_ind---*/
    } /*---axis---*/
  } /*---octant_in_block---*/
}